

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_connection.c
# Opt level: O1

int amqp_handle_input(amqp_connection_state_t state,amqp_bytes_t received_data,
                     amqp_frame_t *decoded_frame)

{
  amqp_connection_state_enum aVar1;
  undefined4 uVar2;
  undefined4 *puVar3;
  ushort uVar4;
  int iVar5;
  ulong uVar6;
  amqp_pool_t *paVar7;
  ulong uVar8;
  int *piVar9;
  ulong __n;
  uint uVar10;
  bool bVar11;
  amqp_bytes_t encoded;
  amqp_bytes_t encoded_00;
  
  uVar8 = received_data.len;
  decoded_frame->frame_type = '\0';
  if (uVar8 == 0) {
    return 0;
  }
  if (state->state == CONNECTION_STATE_IDLE) {
    state->state = CONNECTION_STATE_HEADER;
  }
  __n = state->target_size - state->inbound_offset;
  if (uVar8 < __n) {
    __n = uVar8;
  }
  memcpy((void *)(state->inbound_offset + (long)(state->inbound_buffer).bytes),received_data.bytes,
         __n);
  uVar6 = state->inbound_offset + __n;
  state->inbound_offset = uVar6;
  if (uVar6 < state->target_size) goto LAB_0010548a;
  piVar9 = (int *)(state->inbound_buffer).bytes;
  aVar1 = state->state;
  if (aVar1 != CONNECTION_STATE_BODY) {
    if (aVar1 == CONNECTION_STATE_HEADER) {
LAB_0010520a:
      uVar10 = *(uint *)((long)piVar9 + 3);
      uVar10 = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18;
      iVar5 = -2;
      if ((uVar10 < 0x7fffffff) &&
         (uVar6 = (ulong)(uVar10 + 8), uVar6 <= (ulong)(long)state->frame_max)) {
        paVar7 = amqp_get_or_create_channel_pool
                           (state,*(ushort *)((long)piVar9 + 1) << 8 |
                                  *(ushort *)((long)piVar9 + 1) >> 8);
        iVar5 = -1;
        if (paVar7 != (amqp_pool_t *)0x0) {
          amqp_pool_alloc_bytes(paVar7,uVar6,&state->inbound_buffer);
          puVar3 = (undefined4 *)(state->inbound_buffer).bytes;
          if (puVar3 != (undefined4 *)0x0) {
            uVar2 = *(undefined4 *)state->header_buffer;
            *(undefined4 *)((long)puVar3 + 3) = *(undefined4 *)(state->header_buffer + 3);
            *puVar3 = uVar2;
            piVar9 = (int *)(state->inbound_buffer).bytes;
            state->state = CONNECTION_STATE_BODY;
            state->target_size = uVar6;
            uVar6 = uVar6 - state->inbound_offset;
            if (uVar8 - __n < uVar6) {
              uVar6 = uVar8 - __n;
            }
            memcpy((undefined1 *)(state->inbound_offset + (long)piVar9),
                   (void *)((long)received_data.bytes + __n),uVar6);
            uVar8 = state->inbound_offset + uVar6;
            state->inbound_offset = uVar8;
            __n = __n + uVar6;
            bVar11 = state->target_size <= uVar8;
            iVar5 = (int)__n;
            goto LAB_0010523b;
          }
        }
        bVar11 = false;
      }
      else {
        bVar11 = false;
      }
LAB_0010523b:
      if (!bVar11) {
        return iVar5;
      }
      goto LAB_00105248;
    }
    if (aVar1 != CONNECTION_STATE_INITIAL) {
      amqp_abort("Internal error: invalid amqp_connection_state_t->state %d");
    }
    if (*piVar9 != 0x50514d41) goto LAB_0010520a;
    decoded_frame->frame_type = 'A';
    decoded_frame->channel = 0;
    (decoded_frame->payload).protocol_header.transport_high = (uint8_t)piVar9[1];
    (decoded_frame->payload).protocol_header.transport_low = *(uint8_t *)((long)piVar9 + 5);
    (decoded_frame->payload).protocol_header.protocol_version_major = *(uint8_t *)((long)piVar9 + 6)
    ;
    (decoded_frame->payload).protocol_header.protocol_version_minor = *(uint8_t *)((long)piVar9 + 7)
    ;
    goto switchD_001052a6_caseD_8;
  }
LAB_00105248:
  if (*(char *)((state->target_size - 1) + (long)piVar9) != -0x32) {
    return -2;
  }
  decoded_frame->frame_type = (uint8_t)*piVar9;
  uVar4 = *(ushort *)((long)piVar9 + 1) << 8 | *(ushort *)((long)piVar9 + 1) >> 8;
  decoded_frame->channel = uVar4;
  paVar7 = amqp_get_or_create_channel_pool(state,uVar4);
  if (paVar7 == (amqp_pool_t *)0x0) {
    return -1;
  }
  switch(decoded_frame->frame_type) {
  case '\x01':
    uVar10 = *(uint *)((long)piVar9 + 7);
    uVar10 = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18;
    (decoded_frame->payload).method.id = uVar10;
    encoded.bytes = (undefined1 *)((long)piVar9 + 0xb);
    encoded.len = state->target_size - 0xc;
    iVar5 = amqp_decode_method(uVar10,paVar7,encoded,&(decoded_frame->payload).method.decoded);
    goto LAB_0010542b;
  case '\x02':
    uVar4 = *(ushort *)((long)piVar9 + 7) << 8 | *(ushort *)((long)piVar9 + 7) >> 8;
    (decoded_frame->payload).properties.class_id = uVar4;
    uVar8 = *(ulong *)((long)piVar9 + 0xb);
    (decoded_frame->payload).properties.body_size =
         uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 | (uVar8 & 0xff0000000000) >> 0x18 |
         (uVar8 & 0xff00000000) >> 8 | (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
         (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38;
    encoded_00.bytes = (undefined1 *)((long)piVar9 + 0x13);
    encoded_00.len = state->target_size - 0x14;
    (decoded_frame->payload).properties.raw.len = encoded_00.len;
    (decoded_frame->payload).properties.raw.bytes = encoded_00.bytes;
    iVar5 = amqp_decode_properties
                      (uVar4,paVar7,encoded_00,&(decoded_frame->payload).properties.decoded);
LAB_0010542b:
    if (iVar5 < 0) {
      return iVar5;
    }
    break;
  case '\x03':
    (decoded_frame->payload).body_fragment.len = state->target_size - 8;
    (decoded_frame->payload).method.decoded = (undefined1 *)((long)piVar9 + 7);
    break;
  default:
    decoded_frame->frame_type = '\0';
    break;
  case '\b':
    break;
  }
switchD_001052a6_caseD_8:
  (state->inbound_buffer).len = 8;
  (state->inbound_buffer).bytes = state->header_buffer;
  state->inbound_offset = 0;
  state->target_size = 7;
  state->state = CONNECTION_STATE_IDLE;
LAB_0010548a:
  return (int)__n;
}

Assistant:

int amqp_handle_input(amqp_connection_state_t state, amqp_bytes_t received_data,
                      amqp_frame_t *decoded_frame) {
  size_t bytes_consumed;
  void *raw_frame;

  /* Returning frame_type of zero indicates either insufficient input,
     or a complete, ignored frame was read. */
  decoded_frame->frame_type = 0;

  if (received_data.len == 0) {
    return AMQP_STATUS_OK;
  }

  if (state->state == CONNECTION_STATE_IDLE) {
    state->state = CONNECTION_STATE_HEADER;
  }

  bytes_consumed = consume_data(state, &received_data);

  /* do we have target_size data yet? if not, return with the
     expectation that more will arrive */
  if (state->inbound_offset < state->target_size) {
    return (int)bytes_consumed;
  }

  raw_frame = state->inbound_buffer.bytes;

  switch (state->state) {
    case CONNECTION_STATE_INITIAL:
      /* check for a protocol header from the server */
      if (memcmp(raw_frame, "AMQP", 4) == 0) {
        decoded_frame->frame_type = AMQP_PSEUDOFRAME_PROTOCOL_HEADER;
        decoded_frame->channel = 0;

        decoded_frame->payload.protocol_header.transport_high =
            amqp_d8(amqp_offset(raw_frame, 4));
        decoded_frame->payload.protocol_header.transport_low =
            amqp_d8(amqp_offset(raw_frame, 5));
        decoded_frame->payload.protocol_header.protocol_version_major =
            amqp_d8(amqp_offset(raw_frame, 6));
        decoded_frame->payload.protocol_header.protocol_version_minor =
            amqp_d8(amqp_offset(raw_frame, 7));

        return_to_idle(state);
        return (int)bytes_consumed;
      }

      /* it's not a protocol header; fall through to process it as a
         regular frame header */

    case CONNECTION_STATE_HEADER: {
      amqp_channel_t channel;
      amqp_pool_t *channel_pool;
      uint32_t frame_size;

      channel = amqp_d16(amqp_offset(raw_frame, 1));

      /* frame length is 3 bytes in */
      frame_size = amqp_d32(amqp_offset(raw_frame, 3));
      /* To prevent the target_size calculation below from overflowing, check
       * that the stated frame_size is smaller than a signed 32-bit. Given
       * the library only allows configuring frame_max as an int32_t, and
       * frame_size is uint32_t, the math below is safe from overflow. */
      if (frame_size >= INT32_MAX) {
        return AMQP_STATUS_BAD_AMQP_DATA;
      }

      frame_size = frame_size + HEADER_SIZE + FOOTER_SIZE;
      if ((size_t)state->frame_max < frame_size) {
        return AMQP_STATUS_BAD_AMQP_DATA;
      }

      channel_pool = amqp_get_or_create_channel_pool(state, channel);
      if (NULL == channel_pool) {
        return AMQP_STATUS_NO_MEMORY;
      }

      amqp_pool_alloc_bytes(channel_pool, frame_size, &state->inbound_buffer);
      if (NULL == state->inbound_buffer.bytes) {
        return AMQP_STATUS_NO_MEMORY;
      }
      memcpy(state->inbound_buffer.bytes, state->header_buffer, HEADER_SIZE);
      raw_frame = state->inbound_buffer.bytes;

      state->state = CONNECTION_STATE_BODY;
      state->target_size = frame_size;
      bytes_consumed += consume_data(state, &received_data);

      /* do we have target_size data yet? if not, return with the
         expectation that more will arrive */
      if (state->inbound_offset < state->target_size) {
        return (int)bytes_consumed;
      }
    }
      /* fall through to process body */

    case CONNECTION_STATE_BODY: {
      amqp_bytes_t encoded;
      int res;
      amqp_pool_t *channel_pool;

      /* Check frame end marker (footer) */
      if (amqp_d8(amqp_offset(raw_frame, state->target_size - 1)) !=
          AMQP_FRAME_END) {
        return AMQP_STATUS_BAD_AMQP_DATA;
      }

      decoded_frame->frame_type = amqp_d8(amqp_offset(raw_frame, 0));
      decoded_frame->channel = amqp_d16(amqp_offset(raw_frame, 1));

      channel_pool =
          amqp_get_or_create_channel_pool(state, decoded_frame->channel);
      if (NULL == channel_pool) {
        return AMQP_STATUS_NO_MEMORY;
      }

      switch (decoded_frame->frame_type) {
        case AMQP_FRAME_METHOD:
          decoded_frame->payload.method.id =
              amqp_d32(amqp_offset(raw_frame, HEADER_SIZE));
          encoded.bytes = amqp_offset(raw_frame, HEADER_SIZE + 4);
          encoded.len = state->target_size - HEADER_SIZE - 4 - FOOTER_SIZE;

          res = amqp_decode_method(decoded_frame->payload.method.id,
                                   channel_pool, encoded,
                                   &decoded_frame->payload.method.decoded);
          if (res < 0) {
            return res;
          }

          break;

        case AMQP_FRAME_HEADER:
          decoded_frame->payload.properties.class_id =
              amqp_d16(amqp_offset(raw_frame, HEADER_SIZE));
          /* unused 2-byte weight field goes here */
          decoded_frame->payload.properties.body_size =
              amqp_d64(amqp_offset(raw_frame, HEADER_SIZE + 4));
          encoded.bytes = amqp_offset(raw_frame, HEADER_SIZE + 12);
          encoded.len = state->target_size - HEADER_SIZE - 12 - FOOTER_SIZE;
          decoded_frame->payload.properties.raw = encoded;

          res = amqp_decode_properties(
              decoded_frame->payload.properties.class_id, channel_pool, encoded,
              &decoded_frame->payload.properties.decoded);
          if (res < 0) {
            return res;
          }

          break;

        case AMQP_FRAME_BODY:
          decoded_frame->payload.body_fragment.len =
              state->target_size - HEADER_SIZE - FOOTER_SIZE;
          decoded_frame->payload.body_fragment.bytes =
              amqp_offset(raw_frame, HEADER_SIZE);
          break;

        case AMQP_FRAME_HEARTBEAT:
          break;

        default:
          /* Ignore the frame */
          decoded_frame->frame_type = 0;
          break;
      }

      return_to_idle(state);
      return (int)bytes_consumed;
    }

    default:
      amqp_abort("Internal error: invalid amqp_connection_state_t->state %d",
                 state->state);
  }
}